

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PtnSkeleton::getBaseSkeleton(UnicodeString *__return_storage_ptr__,PtnSkeleton *this)

{
  short sVar1;
  int32_t iVar2;
  int32_t i;
  int field;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  field = 0;
  do {
    SkeletonFields::appendFieldTo(&this->baseOriginal,field,__return_storage_ptr__);
    field = field + 1;
  } while (field != 0x10);
  icu_63::UnicodeString::operator=(__return_storage_ptr__,__return_storage_ptr__);
  if (this->addedDefaultDayPeriod != '\0') {
    sVar1 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (__return_storage_ptr__->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    iVar2 = icu_63::UnicodeString::doIndexOf(__return_storage_ptr__,L'a',0,iVar2);
    if (-1 < iVar2) {
      icu_63::UnicodeString::doReplace(__return_storage_ptr__,iVar2,1,(UChar *)0x0,0,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PtnSkeleton::getBaseSkeleton() const {
    UnicodeString result;
    result = baseOriginal.appendTo(result);
    int32_t pos;
    if (addedDefaultDayPeriod && (pos = result.indexOf(LOW_A)) >= 0) {
        // for backward compatibility: if DateTimeMatcher.set added a single 'a' that
        // was not in the provided skeleton, remove it here before returning skeleton.
        result.remove(pos, 1);
    }
    return result;
}